

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moment_suite.cpp
# Opt level: O0

void kurtosis_double_suite::test_same(void)

{
  undefined8 local_198;
  value_type local_190 [2];
  undefined8 local_180;
  value_type local_178 [2];
  undefined8 local_168;
  value_type local_160 [2];
  undefined8 local_150;
  value_type local_148 [2];
  undefined8 local_138;
  value_type local_130 [2];
  undefined8 local_120;
  value_type local_118 [2];
  undefined8 local_108;
  value_type local_100 [2];
  undefined8 local_f0;
  value_type local_e8 [2];
  undefined8 local_d8;
  value_type local_d0 [2];
  undefined8 local_c0;
  value_type local_b8 [2];
  undefined8 local_a8;
  value_type local_a0 [2];
  undefined8 local_90;
  value_type local_88 [2];
  undefined8 local_78;
  value_type local_70 [2];
  undefined8 local_60;
  value_type local_58 [2];
  undefined8 local_48;
  value_type local_40 [2];
  undefined1 local_30 [8];
  moment_kurtosis<double> filter;
  
  trial::online::cumulative::basic_moment<double,_(trial::online::with)4>::basic_moment
            ((basic_moment<double,_(trial::online::with)4> *)local_30);
  trial::online::cumulative::basic_moment<double,_(trial::online::with)4>::push
            ((basic_moment<double,_(trial::online::with)4> *)local_30,1.0);
  local_40[0] = trial::online::cumulative::basic_moment<double,_(trial::online::with)1>::mean
                          ((basic_moment<double,_(trial::online::with)1> *)local_30);
  local_48 = 0x3ff0000000000000;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,double,double>
            ("filter.mean()","1.0",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/cumulative/moment_suite.cpp"
             ,0x204,"void kurtosis_double_suite::test_same()",local_40,&local_48);
  local_58[0] = trial::online::cumulative::basic_moment<double,_(trial::online::with)2>::variance
                          ((basic_moment<double,_(trial::online::with)2> *)local_30);
  local_60 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,double,double>
            ("filter.variance()","0.0",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/cumulative/moment_suite.cpp"
             ,0x205,"void kurtosis_double_suite::test_same()",local_58,&local_60);
  local_70[0] = trial::online::cumulative::basic_moment<double,_(trial::online::with)3>::skewness
                          ((basic_moment<double,_(trial::online::with)3> *)local_30);
  local_78 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,double,double>
            ("filter.skewness()","0.0",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/cumulative/moment_suite.cpp"
             ,0x206,"void kurtosis_double_suite::test_same()",local_70,&local_78);
  local_88[0] = trial::online::cumulative::basic_moment<double,_(trial::online::with)4>::kurtosis
                          ((basic_moment<double,_(trial::online::with)4> *)local_30);
  local_90 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,double,double>
            ("filter.kurtosis()","0.0",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/cumulative/moment_suite.cpp"
             ,0x207,"void kurtosis_double_suite::test_same()",local_88,&local_90);
  local_a0[0] = trial::online::cumulative::basic_moment<double,_(trial::online::with)4>::
                unbiased_kurtosis((basic_moment<double,_(trial::online::with)4> *)local_30);
  local_a8 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,double,double>
            ("filter.unbiased_kurtosis()","0.0",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/cumulative/moment_suite.cpp"
             ,0x208,"void kurtosis_double_suite::test_same()",local_a0,&local_a8);
  trial::online::cumulative::basic_moment<double,_(trial::online::with)4>::push
            ((basic_moment<double,_(trial::online::with)4> *)local_30,1.0);
  local_b8[0] = trial::online::cumulative::basic_moment<double,_(trial::online::with)1>::mean
                          ((basic_moment<double,_(trial::online::with)1> *)local_30);
  local_c0 = 0x3ff0000000000000;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,double,double>
            ("filter.mean()","1.0",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/cumulative/moment_suite.cpp"
             ,0x20a,"void kurtosis_double_suite::test_same()",local_b8,&local_c0);
  local_d0[0] = trial::online::cumulative::basic_moment<double,_(trial::online::with)2>::variance
                          ((basic_moment<double,_(trial::online::with)2> *)local_30);
  local_d8 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,double,double>
            ("filter.variance()","0.0",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/cumulative/moment_suite.cpp"
             ,0x20b,"void kurtosis_double_suite::test_same()",local_d0,&local_d8);
  local_e8[0] = trial::online::cumulative::basic_moment<double,_(trial::online::with)3>::skewness
                          ((basic_moment<double,_(trial::online::with)3> *)local_30);
  local_f0 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,double,double>
            ("filter.skewness()","0.0",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/cumulative/moment_suite.cpp"
             ,0x20c,"void kurtosis_double_suite::test_same()",local_e8,&local_f0);
  local_100[0] = trial::online::cumulative::basic_moment<double,_(trial::online::with)4>::kurtosis
                           ((basic_moment<double,_(trial::online::with)4> *)local_30);
  local_108 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,double,double>
            ("filter.kurtosis()","0.0",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/cumulative/moment_suite.cpp"
             ,0x20d,"void kurtosis_double_suite::test_same()",local_100,&local_108);
  local_118[0] = trial::online::cumulative::basic_moment<double,_(trial::online::with)4>::
                 unbiased_kurtosis((basic_moment<double,_(trial::online::with)4> *)local_30);
  local_120 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,double,double>
            ("filter.unbiased_kurtosis()","0.0",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/cumulative/moment_suite.cpp"
             ,0x20e,"void kurtosis_double_suite::test_same()",local_118,&local_120);
  trial::online::cumulative::basic_moment<double,_(trial::online::with)4>::push
            ((basic_moment<double,_(trial::online::with)4> *)local_30,1.0);
  local_130[0] = trial::online::cumulative::basic_moment<double,_(trial::online::with)1>::mean
                           ((basic_moment<double,_(trial::online::with)1> *)local_30);
  local_138 = 0x3ff0000000000000;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,double,double>
            ("filter.mean()","1.0",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/cumulative/moment_suite.cpp"
             ,0x210,"void kurtosis_double_suite::test_same()",local_130,&local_138);
  local_148[0] = trial::online::cumulative::basic_moment<double,_(trial::online::with)2>::variance
                           ((basic_moment<double,_(trial::online::with)2> *)local_30);
  local_150 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,double,double>
            ("filter.variance()","0.0",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/cumulative/moment_suite.cpp"
             ,0x211,"void kurtosis_double_suite::test_same()",local_148,&local_150);
  local_160[0] = trial::online::cumulative::basic_moment<double,_(trial::online::with)3>::skewness
                           ((basic_moment<double,_(trial::online::with)3> *)local_30);
  local_168 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,double,double>
            ("filter.skewness()","0.0",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/cumulative/moment_suite.cpp"
             ,0x212,"void kurtosis_double_suite::test_same()",local_160,&local_168);
  local_178[0] = trial::online::cumulative::basic_moment<double,_(trial::online::with)4>::kurtosis
                           ((basic_moment<double,_(trial::online::with)4> *)local_30);
  local_180 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,double,double>
            ("filter.kurtosis()","0.0",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/cumulative/moment_suite.cpp"
             ,0x213,"void kurtosis_double_suite::test_same()",local_178,&local_180);
  local_190[0] = trial::online::cumulative::basic_moment<double,_(trial::online::with)4>::
                 unbiased_kurtosis((basic_moment<double,_(trial::online::with)4> *)local_30);
  local_198 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,double,double>
            ("filter.unbiased_kurtosis()","0.0",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/cumulative/moment_suite.cpp"
             ,0x214,"void kurtosis_double_suite::test_same()",local_190,&local_198);
  return;
}

Assistant:

void test_same()
{
    cumulative::moment_kurtosis<double> filter;
    filter.push(1.0);
    TRIAL_TEST_EQ(filter.mean(), 1.0);
    TRIAL_TEST_EQ(filter.variance(), 0.0);
    TRIAL_TEST_EQ(filter.skewness(), 0.0);
    TRIAL_TEST_EQ(filter.kurtosis(), 0.0);
    TRIAL_TEST_EQ(filter.unbiased_kurtosis(), 0.0);
    filter.push(1.0);
    TRIAL_TEST_EQ(filter.mean(), 1.0);
    TRIAL_TEST_EQ(filter.variance(), 0.0);
    TRIAL_TEST_EQ(filter.skewness(), 0.0);
    TRIAL_TEST_EQ(filter.kurtosis(), 0.0);
    TRIAL_TEST_EQ(filter.unbiased_kurtosis(), 0.0);
    filter.push(1.0);
    TRIAL_TEST_EQ(filter.mean(), 1.0);
    TRIAL_TEST_EQ(filter.variance(), 0.0);
    TRIAL_TEST_EQ(filter.skewness(), 0.0);
    TRIAL_TEST_EQ(filter.kurtosis(), 0.0);
    TRIAL_TEST_EQ(filter.unbiased_kurtosis(), 0.0);
}